

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ParseEditorChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  short sVar1;
  uint _limit;
  Logger *this_01;
  Chunk chunk;
  char buff [10];
  allocator local_203;
  Chunk local_202;
  uint local_1fc;
  char *local_1f8 [4];
  char local_1d2 [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [376];
  
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&local_202);
    } while ((int)(local_202.Size - 6) < 1);
    this_00 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_00,(local_202.Size - 6) +
                                (*(int *)&this_00->current - *(int *)&this_00->buffer));
    if (local_202.Flag == 2) {
      local_1fc = _limit;
      sVar1 = StreamReader<false,_false>::Get<short>(this->stream);
      ASSIMP_itoa10<10ul>(&local_1d2,(int)sVar1);
      this_01 = DefaultLogger::get();
      std::__cxx11::string::string((string *)&local_1c8,"3DS file format version: ",&local_203);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>(local_1a8,&local_1c8);
      std::operator<<((ostream *)local_1a8,local_1d2);
      std::__cxx11::stringbuf::str();
      Logger::info(this_01,local_1f8[0]);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      _limit = local_1fc;
    }
    else if (local_202.Flag == 0xb000) {
      ParseKeyframeChunk(this);
    }
    else if (local_202.Flag == 0x3d3d) {
      ParseObjectChunk(this);
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
  } while (*(int *)&this->stream->limit != *(int *)&this->stream->current);
  return;
}

Assistant:

void Discreet3DSImporter::ParseEditorChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_OBJMESH:

        ParseObjectChunk();
        break;

    // NOTE: In several documentations in the internet this
    // chunk appears at different locations
    case Discreet3DS::CHUNK_KEYFRAMER:

        ParseKeyframeChunk();
        break;

    case Discreet3DS::CHUNK_VERSION:
        {
        // print the version number
        char buff[10];
        ASSIMP_itoa10(buff,stream->GetI2());
        ASSIMP_LOG_INFO_F(std::string("3DS file format version: "), buff);
        }
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}